

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O1

char * sx_trim_whitespace(char *dest,int dest_sz,char *src)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar2 = sx_strlen(src);
  uVar1 = dest_sz - 1U;
  if ((int)uVar2 < (int)(dest_sz - 1U)) {
    uVar1 = uVar2;
  }
  uVar4 = 0;
  if (0 < (int)uVar1) {
    uVar5 = 0;
    do {
      uVar2 = (int)src[uVar5] - 1;
      if ((0x1f < uVar2) || ((0x80001f00U >> (uVar2 & 0x1f) & 1) == 0)) {
        iVar3 = (int)uVar4;
        uVar4 = (ulong)(iVar3 + 1);
        dest[iVar3] = src[uVar5];
      }
      uVar5 = uVar5 + 1;
    } while (uVar1 != uVar5);
    uVar4 = (ulong)(int)uVar4;
  }
  dest[uVar4] = '\0';
  return dest;
}

Assistant:

char* sx_trim_whitespace(char* dest, int dest_sz, const char* src)
{
    int len = sx_min(sx_strlen(src), dest_sz - 1);
    int offset = 0;
    for (int i = 0; i < len; i++) {
        if (!sx_isspace(src[i]))
            dest[offset++] = src[i];
    }
    dest[offset] = '\0';
    return dest;
}